

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.cpp
# Opt level: O0

int __thiscall CRegexParser::parse_int(CRegexParser *this,utf8_ptr *p,size_t *chrem)

{
  int iVar1;
  wchar_t c;
  utf8_ptr *in_RDX;
  bool bVar2;
  int acc;
  int local_24;
  
  if (in_RDX->p_ != (char *)0x0) {
    utf8_ptr::getch((utf8_ptr *)0x32f7b8);
    iVar1 = is_digit(L'\0');
    if (iVar1 != 0) {
      local_24 = 0;
      while( true ) {
        bVar2 = false;
        if (in_RDX->p_ != (char *)0x0) {
          utf8_ptr::getch((utf8_ptr *)0x32f7f4);
          iVar1 = is_digit(L'\0');
          bVar2 = iVar1 != 0;
        }
        if (!bVar2) break;
        c = utf8_ptr::getch((utf8_ptr *)0x32f822);
        iVar1 = value_of_digit(c);
        local_24 = iVar1 + local_24 * 10;
        utf8_ptr::inc(in_RDX);
        in_RDX->p_ = in_RDX->p_ + -1;
      }
      return local_24;
    }
  }
  return -1;
}

Assistant:

int CRegexParser::parse_int(utf8_ptr *p, size_t *chrem)
{
    /* if it's not a number to start with, simply return -1 */
    if (*chrem == 0 || !is_digit(p->getch()))
        return -1;
    
    /* keep going as long as we find digits */
    int acc;
    for (acc = 0 ; *chrem > 0 && is_digit(p->getch()) ; p->inc(), --*chrem)
    {
        /* add this digit into the accumulator */
        acc *= 10;
        acc += value_of_digit(p->getch());
    }

    /* return the accumulated result */
    return acc;
}